

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  Rep *pRVar1;
  Tokenizer *pTVar2;
  bool bVar3;
  bool bVar4;
  DescriptorProto_ReservedRange *obj;
  void *pvVar5;
  char *error;
  RepeatedPtrFieldBase *this_00;
  int iVar6;
  int iVar7;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_b8;
  int local_b4;
  LocationRecorder *local_b0;
  LocationRecorder local_a8;
  DescriptorProto *local_90;
  RepeatedPtrFieldBase *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  this_00 = &(message->reserved_range_).super_RepeatedPtrFieldBase;
  bVar4 = true;
  local_b0 = parent_location;
  local_90 = message;
  local_88 = this_00;
  do {
    LocationRecorder::LocationRecorder
              (&local_48,local_b0,
               (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    pRVar1 = (message->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1 == (Rep *)0x0) {
LAB_0033fa00:
      obj = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                      (this_00->arena_);
      pvVar5 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,obj);
    }
    else {
      iVar7 = (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar1->allocated_size <= iVar7) goto LAB_0033fa00;
      (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
      pvVar5 = pRVar1->elements[iVar7];
    }
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    LocationRecorder::LocationRecorder(&local_a8,&local_48,1);
    pTVar2 = this->input_;
    local_80._0_4_ = (pTVar2->current_).type;
    std::__cxx11::string::_M_assign((string *)&local_78);
    local_50 = (pTVar2->current_).end_column;
    local_58._0_4_ = (pTVar2->current_).line;
    local_58._4_4_ = (pTVar2->current_).column;
    error = "Expected field number range.";
    if (bVar4) {
      error = "Expected field name or number range.";
    }
    bVar3 = ConsumeInteger(this,&local_b4,error);
    LocationRecorder::~LocationRecorder(&local_a8);
    if (bVar3) {
      bVar3 = TryConsume(this,"to");
      if (bVar3) {
        LocationRecorder::LocationRecorder(&local_a8,&local_48,2);
        bVar3 = TryConsume(this,"max");
        iVar7 = -2;
        if ((!bVar3) &&
           (bVar3 = ConsumeInteger(this,&local_b8,"Expected integer."), iVar7 = local_b8, !bVar3)) {
          LocationRecorder::~LocationRecorder(&local_a8);
          bVar3 = false;
          goto LAB_0033fb7f;
        }
        LocationRecorder::~LocationRecorder(&local_a8);
        iVar6 = local_b4;
      }
      else {
        LocationRecorder::LocationRecorder(&local_a8,&local_48,2);
        LocationRecorder::StartAt(&local_a8,(Token *)local_80);
        LocationRecorder::EndAt(&local_a8,(Token *)local_80);
        iVar7 = local_b4;
        LocationRecorder::~LocationRecorder(&local_a8);
        iVar6 = iVar7;
      }
      local_b8 = iVar7 + 1;
      *(int *)((long)pvVar5 + 0x18) = iVar6;
      *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 3;
      *(int *)((long)pvVar5 + 0x1c) = local_b8;
      bVar3 = true;
      bVar4 = false;
    }
    else {
      bVar3 = false;
    }
LAB_0033fb7f:
    this_00 = local_88;
    message = local_90;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    LocationRecorder::~LocationRecorder(&local_48);
    if (!bVar3) {
      return false;
    }
    bVar3 = TryConsume(this,",");
    if (!bVar3) {
      bVar4 = ConsumeEndOfDeclaration(this,";",local_b0);
      return bVar4;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(DescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    DescriptorProto::ReservedRange* range = message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, DescriptorProto::ReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, (first ? "Expected field name or number range."
                                       : "Expected field number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}